

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS
ref_smooth_tri_ratio_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_ratio,REF_DBL *max_ratio)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  REF_INT cell;
  double dVar7;
  REF_DBL ratio;
  REF_INT nodes [27];
  double local_c0;
  ulong local_b8;
  REF_NODE local_b0;
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  uVar5 = 0xffffffff;
  if (-1 < node) {
    uVar5 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar5 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar5 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar5].ref;
    local_b0 = ref_grid->node;
    bVar3 = true;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x87,"ref_smooth_tri_ratio_around",(ulong)uVar4,"nodes");
        return uVar4;
      }
      local_b8 = uVar5;
      if (0 < ref_cell->node_per) {
        lVar6 = 0;
        do {
          if (local_a8[lVar6] != node) {
            uVar4 = ref_node_ratio(local_b0,node,local_a8[lVar6],&local_c0);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x8a,"ref_smooth_tri_ratio_around",(ulong)uVar4,"ratio");
              return uVar4;
            }
            if (bVar3) {
              *min_ratio = local_c0;
              dVar7 = local_c0;
            }
            else {
              dVar7 = *min_ratio;
              if (local_c0 <= *min_ratio) {
                dVar7 = local_c0;
              }
              *min_ratio = dVar7;
              dVar7 = *max_ratio;
              if (*max_ratio <= local_c0) {
                dVar7 = local_c0;
              }
            }
            *max_ratio = dVar7;
            bVar3 = false;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < ref_cell->node_per);
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)local_b8].next;
      uVar5 = (ulong)iVar1;
      if (uVar5 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar5].ref;
      }
    } while (iVar1 != -1);
    if (!bVar3) {
      return 0;
    }
  }
  *min_ratio = 2000.0;
  *max_ratio = -2.0;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x9a,
         "ref_smooth_tri_ratio_around","no triangle found, can not compute ratio");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_ratio_around(REF_GRID ref_grid, REF_INT node,
                                               REF_DBL *min_ratio,
                                               REF_DBL *max_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL ratio;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node != nodes[cell_node]) {
        RSS(ref_node_ratio(ref_node, node, nodes[cell_node], &ratio), "ratio");
        if (none_found) {
          none_found = REF_FALSE;
          *min_ratio = ratio;
          *max_ratio = ratio;
        } else {
          *min_ratio = MIN(*min_ratio, ratio);
          *max_ratio = MAX(*max_ratio, ratio);
        }
      }
    }
  }

  if (none_found) {
    *min_ratio = 2000.0;
    *max_ratio = -2.0;
    THROW("no triangle found, can not compute ratio");
  }

  return REF_SUCCESS;
}